

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall CGL::AppConfig::AppConfig(AppConfig *this,AppConfig *param_2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[4];
  uVar6 = in_RSI[5];
  uVar7 = in_RSI[6];
  uVar8 = in_RSI[7];
  uVar9 = *(undefined8 *)((long)in_RSI + 0x39);
  uVar10 = *(undefined8 *)((long)in_RSI + 0x41);
  uVar11 = *(undefined8 *)((long)in_RSI + 0x49);
  *(undefined8 *)((long)in_RDI + 0x31) = *(undefined8 *)((long)in_RSI + 0x31);
  *(undefined8 *)((long)in_RDI + 0x39) = uVar9;
  *(undefined8 *)((long)in_RDI + 0x41) = uVar10;
  *(undefined8 *)((long)in_RDI + 0x49) = uVar11;
  in_RDI[4] = uVar5;
  in_RDI[5] = uVar6;
  in_RDI[6] = uVar7;
  in_RDI[7] = uVar8;
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  std::__cxx11::string::string((string *)(in_RDI + 0xb),(string *)(in_RSI + 0xb));
  uVar1 = in_RSI[0x10];
  in_RDI[0xf] = in_RSI[0xf];
  in_RDI[0x10] = uVar1;
  std::__cxx11::string::string((string *)(in_RDI + 0x11),(string *)(in_RSI + 0x11));
  uVar1 = in_RSI[0x16];
  in_RDI[0x15] = in_RSI[0x15];
  in_RDI[0x16] = uVar1;
  std::__cxx11::string::string((string *)(in_RDI + 0x17),(string *)(in_RSI + 0x17));
  return;
}

Assistant:

AppConfig () {

    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 1;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;

    pathtracer_samples_per_patch = 32;
    pathtracer_max_tolerance = 0.05f;
    pathtracer_direct_hemisphere_sample = false;

    pathtracer_filename = "";
    pathtracer_lensRadius = 0.0;
    pathtracer_focalDistance = 4.7;

    // Begin Lens Flare implementation
    aperture_filename = "";
    pathtracer_lens_flare_radius = 25.0;
    pathtracer_lens_flare_intensity = 1;
		ghost_aperture_filename = "";
  }